

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O2

void generateMipmaps(ktxVulkanTexture *vkTexture,ktxVulkanDeviceInfo *vdi,VkFilter blitFilter,
                    VkImageLayout initialLayout)

{
  uint uVar1;
  VkImageLayout newLayout;
  VkCommandBuffer pVVar2;
  VkImage pVVar3;
  ktxVulkanFunctions vkFuncs;
  ktxVulkanFunctions vkFuncs_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  byte bVar4;
  long lVar5;
  uint uVar6;
  undefined4 in_register_00000014;
  ktxVulkanFunctions *pkVar7;
  uint uVar8;
  undefined8 *puVar9;
  uint uVar10;
  byte bVar11;
  undefined1 in_stack_fffffffffffffdf8 [232];
  PFN_vkWaitForFences in_stack_fffffffffffffee0;
  VkImageMemoryBarrier local_f8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint32_t local_98;
  ktxVulkanFunctions *local_90;
  undefined8 local_88;
  VkImageBlit local_80;
  
  local_88 = CONCAT44(in_register_00000014,blitFilter);
  bVar11 = 0;
  local_a8 = 1;
  uStack_a0 = 1;
  local_98 = vkTexture->layerCount;
  local_90 = &vdi->vkFuncs;
  pVVar2 = vdi->cmdBuffer;
  pVVar3 = vkTexture->image;
  pkVar7 = local_90;
  puVar9 = (undefined8 *)&stack0xfffffffffffffdf8;
  for (lVar5 = 0x1e; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = pkVar7->vkGetInstanceProcAddr;
    pkVar7 = (ktxVulkanFunctions *)&pkVar7->vkGetDeviceProcAddr;
    puVar9 = puVar9 + 1;
  }
  vkFuncs.vkWaitForFences = in_stack_fffffffffffffee0;
  vkFuncs.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffdf8._0_8_;
  vkFuncs.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffdf8._8_8_;
  vkFuncs.vkAllocateCommandBuffers = (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffdf8._16_8_;
  vkFuncs.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffdf8._24_8_;
  vkFuncs.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffdf8._32_8_;
  vkFuncs.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffdf8._40_8_;
  vkFuncs.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffdf8._48_8_;
  vkFuncs.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffdf8._56_8_;
  vkFuncs.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffdf8._64_8_;
  vkFuncs.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)in_stack_fffffffffffffdf8._72_8_;
  vkFuncs.vkCreateImage = (PFN_vkCreateImage)in_stack_fffffffffffffdf8._80_8_;
  vkFuncs.vkDestroyImage = (PFN_vkDestroyImage)in_stack_fffffffffffffdf8._88_8_;
  vkFuncs.vkCreateBuffer = (PFN_vkCreateBuffer)in_stack_fffffffffffffdf8._96_8_;
  vkFuncs.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffdf8._104_8_;
  vkFuncs.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffdf8._112_8_;
  vkFuncs.vkDestroyFence = (PFN_vkDestroyFence)in_stack_fffffffffffffdf8._120_8_;
  vkFuncs.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffdf8._128_8_;
  vkFuncs.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffdf8._136_8_;
  vkFuncs.vkFreeMemory = (PFN_vkFreeMemory)in_stack_fffffffffffffdf8._144_8_;
  vkFuncs.vkGetBufferMemoryRequirements =
       (PFN_vkGetBufferMemoryRequirements)in_stack_fffffffffffffdf8._152_8_;
  vkFuncs.vkGetImageMemoryRequirements =
       (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffdf8._160_8_;
  vkFuncs.vkGetImageSubresourceLayout =
       (PFN_vkGetImageSubresourceLayout)in_stack_fffffffffffffdf8._168_8_;
  vkFuncs.vkGetPhysicalDeviceImageFormatProperties =
       (PFN_vkGetPhysicalDeviceImageFormatProperties)in_stack_fffffffffffffdf8._176_8_;
  vkFuncs.vkGetPhysicalDeviceFormatProperties =
       (PFN_vkGetPhysicalDeviceFormatProperties)in_stack_fffffffffffffdf8._184_8_;
  vkFuncs.vkGetPhysicalDeviceMemoryProperties =
       (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffdf8._192_8_;
  vkFuncs.vkMapMemory = (PFN_vkMapMemory)in_stack_fffffffffffffdf8._200_8_;
  vkFuncs.vkQueueSubmit = (PFN_vkQueueSubmit)in_stack_fffffffffffffdf8._208_8_;
  vkFuncs.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffdf8._216_8_;
  vkFuncs.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffdf8._224_8_;
  subresourceRange.levelCount = (undefined4)uStack_a0;
  subresourceRange.baseArrayLayer = uStack_a0._4_4_;
  subresourceRange.aspectMask = (undefined4)local_a8;
  subresourceRange.baseMipLevel = local_a8._4_4_;
  subresourceRange.layerCount = local_98;
  setImageLayout(vkFuncs,pVVar2,pVVar3,initialLayout,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                 subresourceRange);
  uVar10 = 1;
  while( true ) {
    if (vkTexture->levelCount <= uVar10) break;
    local_80.dstOffsets[0].x = 0;
    local_80.dstOffsets[0].y = 0;
    local_80.dstOffsets[0].z = 0;
    local_80.dstSubresource.baseArrayLayer = 0;
    local_80.srcOffsets[0].x = 0;
    local_80.srcOffsets[0].y = 0;
    uVar1 = vkTexture->layerCount;
    local_80.srcSubresource._8_8_ = (ulong)uVar1 << 0x20;
    local_80.srcSubresource.mipLevel = uVar10 - 1;
    bVar4 = (byte)local_80.srcSubresource.mipLevel;
    uVar6 = vkTexture->width >> (bVar4 & 0x1f);
    local_80.srcOffsets._8_8_ = (ulong)(uVar6 + (uVar6 == 0)) << 0x20;
    uVar6 = vkTexture->height >> (bVar4 & 0x1f);
    uVar8 = vkTexture->depth >> (bVar4 & 0x1f);
    local_80.srcOffsets[1].z = uVar8 + (uVar8 == 0);
    local_80.srcOffsets[1].y = uVar6 + (uVar6 == 0);
    bVar4 = (byte)uVar10;
    uVar6 = vkTexture->width >> (bVar4 & 0x1f);
    local_80.dstOffsets[1].x = uVar6 + (uVar6 == 0);
    uVar6 = vkTexture->height >> (bVar4 & 0x1f);
    local_80.dstSubresource.mipLevel = uVar10;
    local_80.dstSubresource.aspectMask = 1;
    local_80.dstOffsets[1].y = uVar6 + (uVar6 == 0);
    uVar6 = vkTexture->depth >> (bVar4 & 0x1f);
    local_80.dstOffsets[1].z = uVar6 + (uVar6 == 0);
    local_f8.image = vkTexture->image;
    local_f8.pNext = (void *)0x0;
    local_f8.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    local_f8._4_4_ = 0;
    local_f8.srcQueueFamilyIndex = 0xffffffff;
    local_f8.dstQueueFamilyIndex = 0xffffffff;
    local_f8.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    local_f8.newLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
    local_f8.subresourceRange.baseMipLevel = uVar10;
    local_f8.subresourceRange.aspectMask = 1;
    local_f8.subresourceRange.levelCount = 1;
    local_f8.subresourceRange.baseArrayLayer = 0;
    local_f8._68_4_ = 0;
    local_f8.subresourceRange.layerCount = uVar1;
    local_f8.srcAccessMask = 0;
    local_f8.dstAccessMask = 0x1000;
    local_80.srcSubresource.aspectMask = 1;
    local_80.dstSubresource.layerCount = 1;
    (*(vdi->vkFuncs).vkCmdPipelineBarrier)
              (vdi->cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,
               (VkBufferMemoryBarrier *)0x0,1,&local_f8);
    (*(vdi->vkFuncs).vkCmdBlitImage)
              (vdi->cmdBuffer,vkTexture->image,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,vkTexture->image
               ,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,&local_80,(VkFilter)local_88);
    local_f8.image = vkTexture->image;
    local_f8.pNext = (void *)0x0;
    local_f8.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    local_f8._4_4_ = 0;
    local_f8.srcQueueFamilyIndex = 0xffffffff;
    local_f8.dstQueueFamilyIndex = 0xffffffff;
    local_f8.subresourceRange.aspectMask = 1;
    local_f8.subresourceRange.levelCount = 1;
    local_f8.subresourceRange.baseArrayLayer = 0;
    local_f8._68_4_ = 0;
    local_f8.srcAccessMask = 0x1800;
    local_f8.dstAccessMask = 0x800;
    local_f8.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
    local_f8.newLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
    in_stack_fffffffffffffee0 = (PFN_vkWaitForFences)0x1fd75a;
    (*(vdi->vkFuncs).vkCmdPipelineBarrier)
              (vdi->cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,
               (VkBufferMemoryBarrier *)0x0,1,&local_f8);
    uVar10 = uVar10 + 1;
  }
  uStack_a0 = CONCAT44(uStack_a0._4_4_,vkTexture->levelCount);
  pVVar2 = vdi->cmdBuffer;
  pVVar3 = vkTexture->image;
  newLayout = vkTexture->imageLayout;
  pkVar7 = local_90;
  puVar9 = (undefined8 *)&stack0xfffffffffffffdf8;
  for (lVar5 = 0x1e; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = pkVar7->vkGetInstanceProcAddr;
    pkVar7 = (ktxVulkanFunctions *)((long)pkVar7 + (ulong)bVar11 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  vkFuncs_00.vkWaitForFences = in_stack_fffffffffffffee0;
  vkFuncs_00.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffdf8._0_8_;
  vkFuncs_00.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffdf8._8_8_;
  vkFuncs_00.vkAllocateCommandBuffers =
       (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffdf8._16_8_;
  vkFuncs_00.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffdf8._24_8_;
  vkFuncs_00.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffdf8._32_8_;
  vkFuncs_00.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffdf8._40_8_;
  vkFuncs_00.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffdf8._48_8_;
  vkFuncs_00.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffdf8._56_8_;
  vkFuncs_00.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffdf8._64_8_;
  vkFuncs_00.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)in_stack_fffffffffffffdf8._72_8_;
  vkFuncs_00.vkCreateImage = (PFN_vkCreateImage)in_stack_fffffffffffffdf8._80_8_;
  vkFuncs_00.vkDestroyImage = (PFN_vkDestroyImage)in_stack_fffffffffffffdf8._88_8_;
  vkFuncs_00.vkCreateBuffer = (PFN_vkCreateBuffer)in_stack_fffffffffffffdf8._96_8_;
  vkFuncs_00.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffdf8._104_8_;
  vkFuncs_00.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffdf8._112_8_;
  vkFuncs_00.vkDestroyFence = (PFN_vkDestroyFence)in_stack_fffffffffffffdf8._120_8_;
  vkFuncs_00.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffdf8._128_8_;
  vkFuncs_00.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffdf8._136_8_;
  vkFuncs_00.vkFreeMemory = (PFN_vkFreeMemory)in_stack_fffffffffffffdf8._144_8_;
  vkFuncs_00.vkGetBufferMemoryRequirements =
       (PFN_vkGetBufferMemoryRequirements)in_stack_fffffffffffffdf8._152_8_;
  vkFuncs_00.vkGetImageMemoryRequirements =
       (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffdf8._160_8_;
  vkFuncs_00.vkGetImageSubresourceLayout =
       (PFN_vkGetImageSubresourceLayout)in_stack_fffffffffffffdf8._168_8_;
  vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties =
       (PFN_vkGetPhysicalDeviceImageFormatProperties)in_stack_fffffffffffffdf8._176_8_;
  vkFuncs_00.vkGetPhysicalDeviceFormatProperties =
       (PFN_vkGetPhysicalDeviceFormatProperties)in_stack_fffffffffffffdf8._184_8_;
  vkFuncs_00.vkGetPhysicalDeviceMemoryProperties =
       (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffdf8._192_8_;
  vkFuncs_00.vkMapMemory = (PFN_vkMapMemory)in_stack_fffffffffffffdf8._200_8_;
  vkFuncs_00.vkQueueSubmit = (PFN_vkQueueSubmit)in_stack_fffffffffffffdf8._208_8_;
  vkFuncs_00.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffdf8._216_8_;
  vkFuncs_00.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffdf8._224_8_;
  subresourceRange_00.levelCount = (undefined4)uStack_a0;
  subresourceRange_00.baseArrayLayer = uStack_a0._4_4_;
  subresourceRange_00.aspectMask = (undefined4)local_a8;
  subresourceRange_00.baseMipLevel = local_a8._4_4_;
  subresourceRange_00.layerCount = local_98;
  setImageLayout(vkFuncs_00,pVVar2,pVVar3,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,newLayout,
                 subresourceRange_00);
  return;
}

Assistant:

static void
generateMipmaps(ktxVulkanTexture* vkTexture, ktxVulkanDeviceInfo* vdi,
                VkFilter blitFilter, VkImageLayout initialLayout)
{
    VkImageSubresourceRange subresourceRange;
    memset(&subresourceRange, 0, sizeof(subresourceRange));
    subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.levelCount = 1;
    subresourceRange.baseArrayLayer = 0;
    subresourceRange.layerCount = vkTexture->layerCount;

    // Transition base level to SRC_OPTIMAL for blitting.
    setImageLayout(
        vdi->vkFuncs,
        vdi->cmdBuffer,
        vkTexture->image,
        initialLayout,
        VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
        subresourceRange);

    // Generate the mip chain
    // ----------------------
    // Blit level n from level n-1.
    for (uint32_t i = 1; i < vkTexture->levelCount; i++)
    {
        VkImageBlit imageBlit;
        memset(&imageBlit, 0, sizeof(imageBlit));

        // Source
        imageBlit.srcSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        imageBlit.srcSubresource.layerCount = vkTexture->layerCount;
        imageBlit.srcSubresource.mipLevel = i-1;
        imageBlit.srcOffsets[1].x = MAX(1, vkTexture->width >> (i - 1));
        imageBlit.srcOffsets[1].y = MAX(1, vkTexture->height >> (i - 1));
        imageBlit.srcOffsets[1].z = MAX(1, vkTexture->depth >> (i - 1));;

        // Destination
        imageBlit.dstSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        imageBlit.dstSubresource.layerCount = 1;
        imageBlit.dstSubresource.mipLevel = i;
        imageBlit.dstOffsets[1].x = MAX(1, vkTexture->width >> i);
        imageBlit.dstOffsets[1].y = MAX(1, vkTexture->height >> i);
        imageBlit.dstOffsets[1].z = MAX(1, vkTexture->depth >> i);

        VkImageSubresourceRange mipSubRange;
        memset(&mipSubRange, 0, sizeof(mipSubRange));

        mipSubRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        mipSubRange.baseMipLevel = i;
        mipSubRange.levelCount = 1;
        mipSubRange.layerCount = vkTexture->layerCount;

        // Transiton current mip level to transfer dest
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_UNDEFINED,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            mipSubRange);

        // Blit from previous level
        vdi->vkFuncs.vkCmdBlitImage(
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            1,
            &imageBlit,
            blitFilter);

        // Transiton current mip level to transfer source for read in
        // next iteration.
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
            mipSubRange);
    }

    // After the loop, all mip layers are in TRANSFER_SRC layout.
    // Transition all to final layout.
    subresourceRange.levelCount = vkTexture->levelCount;
    setImageLayout(
        vdi->vkFuncs,
        vdi->cmdBuffer,
        vkTexture->image,
        VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
        vkTexture->imageLayout,
        subresourceRange);
}